

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.cpp
# Opt level: O2

hugeint_t duckdb::DecimalAddOverflowCheck::
          Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (hugeint_t left,hugeint_t right)

{
  bool bVar1;
  OutOfRangeException *this;
  allocator local_a9;
  hugeint_t right_local;
  hugeint_t left_local;
  hugeint_t result;
  string local_78;
  string local_58;
  string local_38;
  
  right_local.upper = right.upper;
  right_local.lower = right.lower;
  left_local.upper = left.upper;
  left_local.lower = left.lower;
  bVar1 = TryDecimalAdd::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (left,right,&result);
  if (bVar1) {
    return result;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Overflow in addition of DECIMAL(38) (%s + %s);",&local_a9);
  hugeint_t::ToString_abi_cxx11_(&local_58,&left_local);
  hugeint_t::ToString_abi_cxx11_(&local_78,&right_local);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_38,&local_58,&local_78);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

hugeint_t DecimalAddOverflowCheck::Operation(hugeint_t left, hugeint_t right) {
	hugeint_t result;
	if (!TryDecimalAdd::Operation(left, right, result)) {
		throw OutOfRangeException("Overflow in addition of DECIMAL(38) (%s + %s);", left.ToString(), right.ToString());
	}
	return result;
}